

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

WORD Output::SetConsoleForeground(WORD color)

{
  AutoCriticalSection local_18;
  AutoCriticalSection autocs;
  WORD color_local;
  
  autocs.cs._6_2_ = color;
  AutoCriticalSection::AutoCriticalSection(&local_18,&s_critsect);
  AutoCriticalSection::~AutoCriticalSection(&local_18);
  return 0;
}

Assistant:

WORD
Output::SetConsoleForeground(WORD color)
{
    AutoCriticalSection autocs(&s_critsect);

    // xplat-todo: support console color
#ifdef _WIN32
    _CONSOLE_SCREEN_BUFFER_INFO info;
    HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);

    if (hConsole && GetConsoleScreenBufferInfo(hConsole, &info))
    {
        Output::Flush();
        Output::s_color = color | (info.wAttributes & ~15);
        Output::s_hasColor = Output::s_color != info.wAttributes;
        return info.wAttributes;
    }
#endif // _WIN32

    return 0;
}